

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::NavRestoreLastChildNavWindow(ImGuiWindow *window)

{
  ImGuiTabItem *pIVar1;
  ImGuiTabItem *tab;
  ImGuiWindow *window_local;
  
  if ((window->NavLastChildNavWindow == (ImGuiWindow *)0x0) ||
     ((window->NavLastChildNavWindow->WasActive & 1U) == 0)) {
    window_local = window;
    if ((window->DockNodeAsHost != (ImGuiDockNode *)0x0) &&
       ((window->DockNodeAsHost->TabBar != (ImGuiTabBar *)0x0 &&
        (pIVar1 = TabBarFindMostRecentlySelectedTabForActiveWindow(window->DockNodeAsHost->TabBar),
        pIVar1 != (ImGuiTabItem *)0x0)))) {
      window_local = pIVar1->Window;
    }
  }
  else {
    window_local = window->NavLastChildNavWindow;
  }
  return window_local;
}

Assistant:

static ImGuiWindow* ImGui::NavRestoreLastChildNavWindow(ImGuiWindow* window)
{
    if (window->NavLastChildNavWindow && window->NavLastChildNavWindow->WasActive)
        return window->NavLastChildNavWindow;
    if (window->DockNodeAsHost && window->DockNodeAsHost->TabBar)
        if (ImGuiTabItem* tab = TabBarFindMostRecentlySelectedTabForActiveWindow(window->DockNodeAsHost->TabBar))
            return tab->Window;
    return window;
}